

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O0

vector<Occupy,_std::allocator<Occupy>_> *
Common::analyzeOccupies
          (vector<Occupy,_std::allocator<Occupy>_> *__return_storage_ptr__,TaskHandle *head,
          size_t peak_memory,uint64_t origin_time)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar1;
  int max;
  int iVar2;
  element_type *peVar3;
  size_type sVar4;
  reference pOVar5;
  iterator iVar6;
  iterator iVar7;
  size_type sVar8;
  reference pvVar9;
  pair<std::_Rb_tree_const_iterator<Occupy>,_bool> pVar10;
  allocator<Occupy> local_2d1;
  _Rb_tree_const_iterator<Occupy> local_2d0;
  _Rb_tree_const_iterator<Occupy> local_2c8;
  _Base_ptr local_2c0;
  undefined1 local_2b8;
  Random local_2b0;
  int local_29c;
  undefined1 local_298 [4];
  int pos;
  Random random;
  int local_278;
  int i_1;
  int local_24c;
  int i;
  int size;
  undefined1 local_230 [8];
  set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_> essentials;
  Occupy copied;
  Occupy *occupy_1;
  iterator __end1;
  iterator __begin1;
  set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_> *__range1;
  vector<Occupy,_std::allocator<Occupy>_> occupies_vec;
  undefined1 local_128 [8];
  Occupy occupy;
  OperandUsage *usage;
  iterator __end2;
  iterator __begin2;
  vector<OperandUsage,_std::allocator<OperandUsage>_> *__range2;
  TaskHandle task_1;
  set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_> occupies;
  undefined1 local_40 [7];
  anon_class_1_0_00000001 append;
  TaskHandle task;
  int peak_time_stamp;
  int time_stamp;
  uint64_t origin_time_local;
  size_t peak_memory_local;
  TaskHandle *head_local;
  
  task.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
  task.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  std::shared_ptr<Task>::shared_ptr((shared_ptr<Task> *)local_40,head);
  while (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40), bVar1) {
    task.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         task.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ + 1;
    peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_40);
    peVar3->time_stamp =
         task.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
    peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_40);
    if (peVar3->execution_memory == peak_memory) {
      task.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
           task.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
    }
    peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_40);
    std::shared_ptr<Task>::operator=((shared_ptr<Task> *)local_40,&peVar3->next);
  }
  std::shared_ptr<Task>::~shared_ptr((shared_ptr<Task> *)local_40);
  if (0 < (int)task.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    std::set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_>::set
              ((set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_> *)
               &task_1.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<Task>::shared_ptr((shared_ptr<Task> *)&__range2,head);
    while (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&__range2), bVar1) {
      peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &__range2);
      if ((int)task.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi <
          peVar3->time_stamp) {
        peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            &__range2);
        __end2 = std::vector<OperandUsage,_std::allocator<OperandUsage>_>::begin(&peVar3->ins);
        usage = (OperandUsage *)
                std::vector<OperandUsage,_std::allocator<OperandUsage>_>::end(&peVar3->ins);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
                                           *)&usage), bVar1) {
          occupy.score2 =
               (double)__gnu_cxx::
                       __normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
                       ::operator*(&__end2);
          bVar1 = std::__shared_ptr::operator_cast_to_bool
                            ((__shared_ptr *)&((reference)occupy.score2)->gen);
          if ((bVar1) &&
             (peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)((long)occupy.score2 + 0x18)),
             peVar3->time_stamp <
             (int)task.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)) {
            std::shared_ptr<Task>::shared_ptr
                      ((shared_ptr<Task> *)local_128,
                       (shared_ptr<Task> *)((long)occupy.score2 + 0x18));
            std::shared_ptr<Task>::shared_ptr
                      ((shared_ptr<Task> *)
                       &occupy.gen.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       (shared_ptr<Task> *)&__range2);
            occupy.use.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            occupy.re_gen.
            super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            occupy.re_gen.
            super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            std::vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>::vector
                      ((vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_> *)
                       &occupy.use.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
            ;
            occupy.re_gen_ins._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
            occupy.re_gen_ins._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
            ;
            occupy.re_gen_ins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            occupy.re_gen_ins._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            occupy.re_gen_ins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            occupy.re_gen.
            super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            occupy.re_gen_ins._M_t._M_impl._0_8_ = 0;
            std::set<OperandUsage,_std::less<OperandUsage>,_std::allocator<OperandUsage>_>::set
                      ((set<OperandUsage,_std::less<OperandUsage>,_std::allocator<OperandUsage>_> *)
                       &occupy.re_gen.
                        super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            occupy.re_gen_ins._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 0;
            occupy.move = false;
            occupy._105_7_ = 0;
            occupy.score1 = 0.0;
            sVar4 = std::set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_>::count
                              ((set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_> *)
                               &task_1.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,(key_type *)local_128);
            if ((sVar4 == 0) &&
               (bVar1 = analyzeOccupies::anon_class_1_0_00000001::operator()
                                  ((anon_class_1_0_00000001 *)
                                   ((long)&occupies._M_t._M_impl.super__Rb_tree_header._M_node_count
                                   + 7),(Occupy *)local_128), bVar1)) {
              pVar10 = std::set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_>::insert
                                 ((set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_> *)
                                  &task_1.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount,(value_type *)local_128);
              occupies_vec.super__Vector_base<Occupy,_std::allocator<Occupy>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)pVar10.first._M_node;
            }
            Occupy::~Occupy((Occupy *)local_128);
          }
          __gnu_cxx::
          __normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
          ::operator++(&__end2);
        }
      }
      peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &__range2);
      std::shared_ptr<Task>::operator=((shared_ptr<Task> *)&__range2,&peVar3->next);
    }
    std::shared_ptr<Task>::~shared_ptr((shared_ptr<Task> *)&__range2);
    std::vector<Occupy,_std::allocator<Occupy>_>::vector
              ((vector<Occupy,_std::allocator<Occupy>_> *)&__range1);
    this = &task_1.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    __end1 = std::set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_>::begin
                       ((set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_> *)this);
    occupy_1 = (Occupy *)
               std::set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_>::end
                         ((set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_> *)this);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&occupy_1), bVar1) {
      pOVar5 = std::_Rb_tree_const_iterator<Occupy>::operator*(&__end1);
      Occupy::Occupy((Occupy *)&essentials._M_t._M_impl.super__Rb_tree_header._M_node_count,pOVar5);
      Occupy::calculate((Occupy *)&essentials._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (int)task.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi,peak_memory,origin_time);
      std::vector<Occupy,_std::allocator<Occupy>_>::push_back
                ((vector<Occupy,_std::allocator<Occupy>_> *)&__range1,
                 (value_type *)&essentials._M_t._M_impl.super__Rb_tree_header._M_node_count);
      Occupy::~Occupy((Occupy *)&essentials._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::_Rb_tree_const_iterator<Occupy>::operator++(&__end1);
    }
    std::set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_>::set
              ((set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_> *)local_230);
    iVar6 = std::vector<Occupy,_std::allocator<Occupy>_>::begin
                      ((vector<Occupy,_std::allocator<Occupy>_> *)&__range1);
    iVar7 = std::vector<Occupy,_std::allocator<Occupy>_>::end
                      ((vector<Occupy,_std::allocator<Occupy>_> *)&__range1);
    std::
    sort<__gnu_cxx::__normal_iterator<Occupy*,std::vector<Occupy,std::allocator<Occupy>>>,Common::analyzeOccupies(std::shared_ptr<Task>&,unsigned_long,unsigned_long)::_lambda(Occupy_const&,Occupy_const&)_1_>
              (iVar6._M_current,iVar7._M_current);
    sVar8 = std::vector<Occupy,_std::allocator<Occupy>_>::size
                      ((vector<Occupy,_std::allocator<Occupy>_> *)&__range1);
    max = (int)sVar8;
    for (local_24c = 0; local_24c < max && local_24c < 2; local_24c = local_24c + 1) {
      pvVar9 = std::vector<Occupy,_std::allocator<Occupy>_>::operator[]
                         ((vector<Occupy,_std::allocator<Occupy>_> *)&__range1,(long)local_24c);
      std::set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_>::insert
                ((set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_> *)local_230,pvVar9);
    }
    iVar6 = std::vector<Occupy,_std::allocator<Occupy>_>::begin
                      ((vector<Occupy,_std::allocator<Occupy>_> *)&__range1);
    iVar7 = std::vector<Occupy,_std::allocator<Occupy>_>::end
                      ((vector<Occupy,_std::allocator<Occupy>_> *)&__range1);
    std::
    sort<__gnu_cxx::__normal_iterator<Occupy*,std::vector<Occupy,std::allocator<Occupy>>>,Common::analyzeOccupies(std::shared_ptr<Task>&,unsigned_long,unsigned_long)::_lambda(Occupy_const&,Occupy_const&)_2_>
              (iVar6._M_current,iVar7._M_current);
    for (local_278 = 0; local_278 < max && local_278 < 2; local_278 = local_278 + 1) {
      pvVar9 = std::vector<Occupy,_std::allocator<Occupy>_>::operator[]
                         ((vector<Occupy,_std::allocator<Occupy>_> *)&__range1,(long)local_278);
      pVar10 = std::set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_>::insert
                         ((set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_> *)local_230,
                          pvVar9);
      random.dist._M_param = (param_type)pVar10.first._M_node;
    }
    Random::Random((Random *)local_298,0,1,0);
    bVar1 = std::vector<Occupy,_std::allocator<Occupy>_>::empty
                      ((vector<Occupy,_std::allocator<Occupy>_> *)&__range1);
    if ((!bVar1) && (iVar2 = Random::operator()((Random *)local_298), iVar2 == 0)) {
      Random::Random(&local_2b0,0,max,0);
      local_29c = Random::operator()(&local_2b0);
      pvVar9 = std::vector<Occupy,_std::allocator<Occupy>_>::operator[]
                         ((vector<Occupy,_std::allocator<Occupy>_> *)&__range1,(long)local_29c);
      pVar10 = std::set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_>::insert
                         ((set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_> *)local_230,
                          pvVar9);
      local_2c0 = (_Base_ptr)pVar10.first._M_node;
      local_2b8 = pVar10.second;
    }
    local_2c8._M_node =
         (_Base_ptr)
         std::set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_>::begin
                   ((set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_> *)local_230);
    local_2d0._M_node =
         (_Base_ptr)
         std::set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_>::end
                   ((set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_> *)local_230);
    std::allocator<Occupy>::allocator(&local_2d1);
    std::vector<Occupy,std::allocator<Occupy>>::vector<std::_Rb_tree_const_iterator<Occupy>,void>
              ((vector<Occupy,std::allocator<Occupy>> *)__return_storage_ptr__,local_2c8,local_2d0,
               &local_2d1);
    std::allocator<Occupy>::~allocator(&local_2d1);
    std::set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_>::~set
              ((set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_> *)local_230);
    std::vector<Occupy,_std::allocator<Occupy>_>::~vector
              ((vector<Occupy,_std::allocator<Occupy>_> *)&__range1);
    std::set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_>::~set
              ((set<Occupy,_std::less<Occupy>,_std::allocator<Occupy>_> *)
               &task_1.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return __return_storage_ptr__;
  }
  __assert_fail("peak_time_stamp > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LyricZhao[P]DLMO/schedule.hpp"
                ,0x235,
                "static std::vector<Occupy> Common::analyzeOccupies(TaskHandle &, size_t, uint64_t)"
               );
}

Assistant:

static std::vector<Occupy> analyzeOccupies(TaskHandle &head, size_t peak_memory, uint64_t origin_time) {
        // Run this function after running analyzeTopology and analyzeMemory
        // Mark tasks and get the peak one
        int time_stamp = 0, peak_time_stamp = 0;
        LOOP(task, head) {
            task->time_stamp = ++ time_stamp;
            if (task->execution_memory == peak_memory) {
                peak_time_stamp = time_stamp;
            }
        }
        assert(peak_time_stamp > 0);

        // Check
        auto append = [](Occupy &occupy) -> bool {
            auto &gen = occupy.gen;
            auto &use = occupy.use;
            occupy.re_gen_ins.insert(gen->ins.begin(), gen->ins.end());

            // We're going to put `gen` before `use`, so we must ensure the inputs of `gen` will not change
            static constexpr int RE_GEN_TASK_LIMIT = 3;
            for (int i = -1; i < RE_GEN_TASK_LIMIT; ++ i) {
                bool found = false;
                OperandUsage bad_usage;
                for (auto &usage: occupy.re_gen_ins) {
                    auto last_gen_before_re_gen = usage.next_gen;
                    while (last_gen_before_re_gen) {
                        auto &re_gen = last_gen_before_re_gen->find(usage.operand);
                        if (re_gen.next_gen and re_gen.next_gen->time_stamp < use->time_stamp) {
                            last_gen_before_re_gen = re_gen.next_gen;
                        } else {
                            break;
                        }
                    }
                    if (last_gen_before_re_gen and last_gen_before_re_gen->time_stamp < use->time_stamp) {
                        auto &re_gen = last_gen_before_re_gen->find(usage.operand);
                        if (re_gen.version != usage.version) {
                            found = true;
                            bad_usage = usage;
                            break;
                        }
                    }
                }
                if (found) {
                    occupy.re_gen.push_back(bad_usage.gen);
                    occupy.re_gen_ins.erase(bad_usage);
                    occupy.re_gen_ins.insert(bad_usage.gen->ins.begin(), bad_usage.gen->ins.end());
                } else {
                    return true;
                }
            }
            return false;
        };

        // Get all occupying pairs
        std::set<Occupy> occupies;
        LOOP(task, head) {
            if (peak_time_stamp >= task->time_stamp) {
                continue;
            }
            for (auto &usage: task->ins) {
                if (usage.gen and usage.gen->time_stamp < peak_time_stamp) {
                    auto occupy = Occupy {usage.gen, task};
                    // .count is a must, because we only accept the first usage
                    if (not occupies.count(occupy) and append(occupy)) {
                        occupies.insert(occupy);
                    }
                }
            }
        }

        // Get scores
        std::vector<Occupy> occupies_vec;
        for (auto &occupy: occupies) {
            auto copied = occupy;
            copied.calculate(peak_time_stamp, peak_memory, origin_time);
            occupies_vec.push_back(copied);
        }

        // O1 Pruning
        std::set<Occupy> essentials;
        std::sort(occupies_vec.begin(), occupies_vec.end(), [](const Occupy &o1, const Occupy &o2) {
            return o1.score1 < o2.score1;
        });
        int size = occupies_vec.size();
        for (int i = 0; i < size and i < O1_OCCUPIES_LIMIT; ++ i) {
            // printf(" > s1: %.3lf s2: %.3lf\n", occupies_vec[i].score1, occupies_vec[i].score2);
            essentials.insert(occupies_vec[i]);
        }

        // O2 Pruning
        std::sort(occupies_vec.begin(), occupies_vec.end(), [](const Occupy &o1, const Occupy &o2) {
            return o1.score2 < o2.score2;
        });
        for (int i = 0; i < size and i < O2_OCCUPIES_LIMIT; ++ i) {
            // printf(" > s1: %.3lf s2: %.3lf\n", occupies_vec[i].score1, occupies_vec[i].score2);
            essentials.insert(occupies_vec[i]);
        }

        // Random
        auto random = Random(0, TIMES_PER_RANDOM);
        if (not occupies_vec.empty() and random() == 0) {
            auto pos = Random(0, size)();
            essentials.insert(occupies_vec[pos]);
        }

        return std::vector<Occupy>(essentials.begin(), essentials.end());
    }